

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sid.cc
# Opt level: O0

int __thiscall
SID::clock_resample_fast(SID *this,cycle_count *delta_t,short *buf,int n,int interleave)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int in_ECX;
  long in_RDX;
  int *in_RSI;
  SID *in_RDI;
  int in_R8D;
  int i_1;
  int half;
  int j;
  int v;
  short *sample_start;
  short *fir_start;
  int fir_offset;
  int i;
  cycle_count delta_t_sample;
  cycle_count next_sample_offset;
  int s;
  int local_60;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  int local_38;
  int local_2c;
  
  local_2c = 0;
  while( true ) {
    uVar1 = in_RDI->sample_offset + in_RDI->cycles_per_sample;
    iVar2 = (int)uVar1 >> 0x10;
    if (*in_RSI < iVar2) {
      for (local_60 = 0; local_60 < *in_RSI; local_60 = local_60 + 1) {
        clock(in_RDI);
        iVar2 = output((SID *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
        in_RDI->sample[in_RDI->sample_index + 0x4000] = (short)iVar2;
        in_RDI->sample[in_RDI->sample_index] = (short)iVar2;
        in_RDI->sample_index = in_RDI->sample_index + 1;
        in_RDI->sample_index = in_RDI->sample_index & 0x3fff;
      }
      in_RDI->sample_offset = in_RDI->sample_offset + *in_RSI * -0x10000;
      *in_RSI = 0;
      return local_2c;
    }
    if (in_ECX <= local_2c) break;
    for (local_38 = 0; local_38 < iVar2; local_38 = local_38 + 1) {
      clock(in_RDI);
      iVar3 = output((SID *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      in_RDI->sample[in_RDI->sample_index + 0x4000] = (short)iVar3;
      in_RDI->sample[in_RDI->sample_index] = (short)iVar3;
      in_RDI->sample_index = in_RDI->sample_index + 1;
      in_RDI->sample_index = in_RDI->sample_index & 0x3fff;
    }
    *in_RSI = *in_RSI - iVar2;
    in_RDI->sample_offset = uVar1 & 0xffff;
    in_stack_ffffffffffffffac = 0;
    for (in_stack_ffffffffffffffa8 = 0; in_stack_ffffffffffffffa8 < in_RDI->fir_N;
        in_stack_ffffffffffffffa8 = in_stack_ffffffffffffffa8 + 1) {
      in_stack_ffffffffffffffac =
           (int)in_RDI->sample
                [(long)in_RDI->sample_index +
                 (((long)in_stack_ffffffffffffffa8 + 0x4000) - (long)in_RDI->fir_N)] *
           (int)in_RDI->fir
                [(long)((in_RDI->sample_offset * in_RDI->fir_RES >> 0x10) * in_RDI->fir_N) +
                 (long)in_stack_ffffffffffffffa8] + in_stack_ffffffffffffffac;
    }
    in_stack_ffffffffffffffac = in_stack_ffffffffffffffac >> 0xf;
    if (in_stack_ffffffffffffffac < 0x8000) {
      if (in_stack_ffffffffffffffac < -0x8000) {
        in_stack_ffffffffffffffac = -0x8000;
      }
    }
    else {
      in_stack_ffffffffffffffac = 0x7fff;
    }
    *(short *)(in_RDX + (long)(local_2c * in_R8D) * 2) = (short)in_stack_ffffffffffffffac;
    local_2c = local_2c + 1;
  }
  return local_2c;
}

Assistant:

RESID_INLINE
int SID::clock_resample_fast(cycle_count& delta_t, short* buf, int n,
			     int interleave)
{
  int s = 0;

  for (;;) {
    cycle_count next_sample_offset = sample_offset + cycles_per_sample;
    cycle_count delta_t_sample = next_sample_offset >> FIXP_SHIFT;
    if (delta_t_sample > delta_t) {
      break;
    }
    if (s >= n) {
      return s;
    }
    for (int i = 0; i < delta_t_sample; i++) {
      clock();
      sample[sample_index] = sample[sample_index + RINGSIZE] = output();
      ++sample_index;
      sample_index &= 0x3fff;
    }
    delta_t -= delta_t_sample;
    sample_offset = next_sample_offset & FIXP_MASK;

    int fir_offset = sample_offset*fir_RES >> FIXP_SHIFT;
    short* fir_start = fir + fir_offset*fir_N;
    short* sample_start = sample + sample_index - fir_N + RINGSIZE;

    // Convolution with filter impulse response.
    int v = 0;
    for (int j = 0; j < fir_N; j++) {
      v += sample_start[j]*fir_start[j];
    }

    v >>= FIR_SHIFT;

    // Saturated arithmetics to guard against 16 bit sample overflow.
    const int half = 1 << 15;
    if (v >= half) {
      v = half - 1;
    }
    else if (v < -half) {
      v = -half;
    }

    buf[s++*interleave] = v;
  }

  for (int i = 0; i < delta_t; i++) {
    clock();
    sample[sample_index] = sample[sample_index + RINGSIZE] = output();
    ++sample_index;
    sample_index &= 0x3fff;
  }
  sample_offset -= delta_t << FIXP_SHIFT;
  delta_t = 0;
  return s;
}